

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

void symhash_add(D_SymHash *sh,D_Sym *s)

{
  D_Sym **ppDVar1;
  D_Sym *pDVar2;
  D_Sym **ppDVar3;
  uint uVar4;
  uint uVar5;
  uint local_88 [2];
  anon_struct_40_4_d8687ec6 tv;
  anon_struct_40_4_d8687ec6 vv;
  D_Sym *x;
  D_Sym **v;
  uint n;
  uint h;
  uint i;
  D_Sym *s_local;
  D_SymHash *sh_local;
  
  uVar4 = s->hash % (sh->syms).n;
  ppDVar1 = (sh->syms).v;
  sh->index = sh->index + 1;
  s->next = ppDVar1[uVar4];
  ppDVar1[uVar4] = s;
  if (sh->grow < sh->index) {
    ppDVar1 = (sh->syms).v;
    tv.e[2]._0_4_ = (sh->syms).n;
    (sh->syms).n = sh->grow;
    sh->grow = sh->grow * 2 + 1;
    ppDVar3 = (D_Sym **)malloc((ulong)(sh->syms).n << 3);
    (sh->syms).v = ppDVar3;
    memset((sh->syms).v,0,(ulong)(sh->syms).n << 3);
    ppDVar3 = (sh->syms).v;
    uVar4 = (sh->syms).n;
    local_88[0] = 0;
    tv.n = 0;
    tv.i = 0;
    for (n = 0; n < (uint)tv.e[2]; n = n + 1) {
      while (ppDVar1[n] != (D_Sym *)0x0) {
        pDVar2 = ppDVar1[n];
        ppDVar1[n] = pDVar2->next;
        if (tv._0_8_ == 0) {
          tv._0_8_ = &tv.v;
          tv.e[(ulong)local_88[0] - 1] = pDVar2;
          local_88[0] = local_88[0] + 1;
        }
        else if ((D_Sym ***)tv._0_8_ == &tv.v) {
          if (local_88[0] < 3) {
            *(D_Sym **)(tv._0_8_ + (ulong)local_88[0] * 8) = pDVar2;
            local_88[0] = local_88[0] + 1;
          }
          else {
LAB_00159559:
            vec_add_internal(local_88,pDVar2);
          }
        }
        else {
          if ((local_88[0] & 7) == 0) goto LAB_00159559;
          *(D_Sym **)(tv._0_8_ + (ulong)local_88[0] * 8) = pDVar2;
          local_88[0] = local_88[0] + 1;
        }
      }
    }
    while (*(long *)(tv._0_8_ + (ulong)n * 8) != 0) {
      pDVar2 = *(D_Sym **)(tv._0_8_ + (ulong)n * 8);
      *(D_Sym **)(tv._0_8_ + (ulong)n * 8) = pDVar2->next;
      uVar5 = pDVar2->hash % uVar4;
      pDVar2->next = ppDVar3[uVar5];
      ppDVar3[uVar5] = pDVar2;
    }
    free(ppDVar1);
  }
  return;
}

Assistant:

static void symhash_add(D_SymHash *sh, D_Sym *s) {
  uint i, h = s->hash % sh->syms.n, n;
  D_Sym **v = sh->syms.v, *x;
  Vec(D_Sym *) vv, tv;

  sh->index++;
  s->next = v[h];
  v[h] = s;

  if (sh->index > sh->grow) {
    vv.v = sh->syms.v;
    vv.n = sh->syms.n;
    sh->syms.n = sh->grow;
    sh->grow = sh->grow * 2 + 1;
    sh->syms.v = MALLOC(sh->syms.n * sizeof(void *));
    memset(sh->syms.v, 0, sh->syms.n * sizeof(void *));
    v = sh->syms.v;
    n = sh->syms.n;
    vec_clear(&tv);
    for (i = 0; i < vv.n; i++) /* use temporary to preserve order */
      while (vv.v[i]) {
        x = vv.v[i];
        vv.v[i] = x->next;
        vec_add(&tv, x);
      }
    while (tv.v[i]) {
      x = tv.v[i];
      tv.v[i] = x->next;
      h = x->hash % n;
      x->next = v[h];
      v[h] = x;
    }
    FREE(vv.v);
  }
}